

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::udp_tracker_connection::update_transaction_id(udp_tracker_connection *this)

{
  tracker_manager *this_00;
  long lVar1;
  uint32_t tid;
  element_type *local_28;
  
  lVar1 = random((aux *)0xfffffffe);
  tid = (int)lVar1 + 1;
  if (this->m_transaction_id != 0) {
    this_00 = (this->super_tracker_connection).m_man;
    shared_from_this((udp_tracker_connection *)&stack0xffffffffffffffd0);
    tracker_manager::update_transaction_id
              (this_00,(shared_ptr<libtorrent::aux::udp_tracker_connection> *)
                       &stack0xffffffffffffffd0,tid);
    if (local_28 != (element_type *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28);
    }
  }
  this->m_transaction_id = tid;
  return;
}

Assistant:

void udp_tracker_connection::update_transaction_id()
	{
		// don't use 0, because that has special meaning (uninitialized)
		std::uint32_t const new_tid = random(0xfffffffe) + 1;

		if (m_transaction_id != 0)
			m_man.update_transaction_id(shared_from_this(), new_tid);
		m_transaction_id = new_tid;
	}